

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_parse_function_generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::ParseFunctionGenerator::GenerateFieldSwitch
          (ParseFunctionGenerator *this,Formatter *format,
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          *ordered_fields)

{
  bool bVar1;
  int field_number;
  WireType wiretype_00;
  reference ppFVar2;
  size_t sVar3;
  uint local_64;
  byte local_5d;
  int local_5c;
  uint32_t uStack_58;
  bool is_repeat;
  int tag_size;
  uint32_t tag;
  WireType wiretype;
  uint32_t local_48;
  uint32_t expected_tag;
  uint32_t fallback_tag;
  FieldDescriptor *field;
  const_iterator __end3;
  const_iterator __begin3;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *__range3;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *ordered_fields_local;
  Formatter *format_local;
  ParseFunctionGenerator *this_local;
  
  Formatter::operator()<>(format,"switch (tag >> 3) {\n");
  Formatter::Indent(format);
  __end3 = std::
           vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
           ::begin(ordered_fields);
  field = (FieldDescriptor *)
          std::
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ::end(ordered_fields);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end3,(__normal_iterator<const_google::protobuf::FieldDescriptor_*const_*,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                                *)&field);
    if (!bVar1) break;
    ppFVar2 = __gnu_cxx::
              __normal_iterator<const_google::protobuf::FieldDescriptor_*const_*,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
              ::operator*(&__end3);
    _fallback_tag = *ppFVar2;
    PrintFieldComment<google::protobuf::FieldDescriptor>(format,_fallback_tag);
    expected_tag = FieldDescriptor::number(_fallback_tag);
    Formatter::operator()(format,"case $1$:\n",(int *)&expected_tag);
    Formatter::Indent(format);
    local_48 = 0;
    wiretype = ExpectedTag(_fallback_tag,&local_48);
    tag = wiretype & 0xff;
    Formatter::operator()
              (format,"if (PROTOBUF_PREDICT_TRUE(static_cast<$uint8$>(tag) == $1$)) {\n",&tag);
    Formatter::Indent(format);
    tag_size = internal::WireFormatLite::GetTagWireType(wiretype);
    field_number = FieldDescriptor::number(_fallback_tag);
    uStack_58 = internal::WireFormatLite::MakeTag(field_number,tag_size);
    sVar3 = io::CodedOutputStream::VarintSize32(uStack_58);
    local_5c = (int)sVar3;
    local_5d = ShouldRepeat(_fallback_tag,tag_size);
    if ((bool)local_5d) {
      Formatter::operator()(format,"ptr -= $1$;\ndo {\n  ptr += $1$;\n",&local_5c);
      Formatter::Indent(format);
    }
    GenerateFieldBody(this,format,tag_size,_fallback_tag);
    if ((local_5d & 1) != 0) {
      Formatter::Outdent(format);
      Formatter::operator()
                (format,
                 "  if (!ctx->DataAvailable(ptr)) break;\n} while (::$proto_ns$::internal::ExpectTag<$1$>(ptr));\n"
                 ,&stack0xffffffffffffffa8);
    }
    Formatter::Outdent(format);
    if (local_48 != 0) {
      local_64 = local_48 & 0xff;
      Formatter::operator()(format,"} else if (static_cast<$uint8$>(tag) == $1$) {\n",&local_64);
      Formatter::Indent(format);
      wiretype_00 = internal::WireFormatLite::GetTagWireType(local_48);
      GenerateFieldBody(this,format,wiretype_00,_fallback_tag);
      Formatter::Outdent(format);
    }
    Formatter::operator()<>(format,"} else\n  goto handle_unusual;\n$next_tag$;\n");
    Formatter::Outdent(format);
    __gnu_cxx::
    __normal_iterator<const_google::protobuf::FieldDescriptor_*const_*,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
    ::operator++(&__end3);
  }
  Formatter::operator()<>(format,"default:\n  goto handle_unusual;\n");
  Formatter::Outdent(format);
  Formatter::operator()<>(format,"}  // switch\n");
  return;
}

Assistant:

void ParseFunctionGenerator::GenerateFieldSwitch(
    Formatter& format,
    const std::vector<const FieldDescriptor*>& ordered_fields) {
  format("switch (tag >> 3) {\n");
  format.Indent();

  for (const auto* field : ordered_fields) {
    PrintFieldComment(format, field);
    format("case $1$:\n", field->number());
    format.Indent();
    uint32_t fallback_tag = 0;
    uint32_t expected_tag = ExpectedTag(field, &fallback_tag);
    format("if (PROTOBUF_PREDICT_TRUE(static_cast<$uint8$>(tag) == $1$)) {\n",
           expected_tag & 0xFF);
    format.Indent();
    auto wiretype = WireFormatLite::GetTagWireType(expected_tag);
    uint32_t tag = WireFormatLite::MakeTag(field->number(), wiretype);
    int tag_size = io::CodedOutputStream::VarintSize32(tag);
    bool is_repeat = ShouldRepeat(field, wiretype);
    if (is_repeat) {
      format(
          "ptr -= $1$;\n"
          "do {\n"
          "  ptr += $1$;\n",
          tag_size);
      format.Indent();
    }
    GenerateFieldBody(format, wiretype, field);
    if (is_repeat) {
      format.Outdent();
      format(
          "  if (!ctx->DataAvailable(ptr)) break;\n"
          "} while (::$proto_ns$::internal::ExpectTag<$1$>(ptr));\n",
          tag);
    }
    format.Outdent();
    if (fallback_tag) {
      format("} else if (static_cast<$uint8$>(tag) == $1$) {\n",
             fallback_tag & 0xFF);
      format.Indent();
      GenerateFieldBody(format, WireFormatLite::GetTagWireType(fallback_tag),
                        field);
      format.Outdent();
    }
    format(
        "} else\n"
        "  goto handle_unusual;\n"
        "$next_tag$;\n");
    format.Outdent();
  }  // for loop over ordered fields

  format(
      "default:\n"
      "  goto handle_unusual;\n");
  format.Outdent();
  format("}  // switch\n");
}